

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uint lhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  bool bVar2;
  uchar uVar3;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_SIL;
  uint in_EDI;
  uint ret;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  undefined1 in_stack_fffffffffffffff4;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar5;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff7;
  uchar local_1;
  
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff7);
  SVar5.m_int = in_SIL.m_int;
  bVar2 = DivisionCornerCaseHelper<unsigned_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1
                    (in_EDI,in_SIL,
                     (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                     )&stack0xfffffffffffffff7);
  SVar1.m_int = in_stack_fffffffffffffff7.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<unsigned_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2
                        (in_EDI,in_SIL,
                         (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&stack0xfffffffffffffff7), SVar1.m_int = in_stack_fffffffffffffff7.m_int
     , !bVar2)) {
    uVar4 = 0;
    uVar3 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)((ulong)CONCAT13(in_stack_fffffffffffffff7.m_int,
                                           CONCAT12(SVar5.m_int,
                                                    CONCAT11(in_SIL.m_int,in_stack_fffffffffffffff4)
                                                   )) << 0x20));
    DivisionHelper<unsigned_int,_unsigned_char,_0>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((uint *)CONCAT17(in_stack_fffffffffffffff7.m_int,
                                CONCAT16(SVar5.m_int,
                                         CONCAT15(in_SIL.m_int,
                                                  CONCAT14(in_stack_fffffffffffffff4,uVar4)))),
               (uchar *)CONCAT17(uVar3,in_stack_ffffffffffffffe8),(uint *)0x135079);
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<unsigned_int>
              ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(in_stack_fffffffffffffff7.m_int,
                        CONCAT16(SVar5.m_int,
                                 CONCAT15(in_SIL.m_int,CONCAT14(in_stack_fffffffffffffff4,uVar4)))),
               (uint *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
    SVar1.m_int = local_1;
  }
  local_1 = SVar1.m_int;
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}